

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::checkValueFixture::checkValueFixture(checkValueFixture *this)

{
  allocator<char> local_31;
  string local_30;
  
  FIX::DataDictionary::DataDictionary(&this->object);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FIX.4.0",&local_31);
  FIX::DataDictionary::setVersion(&this->object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  FIX::DataDictionary::addField(&this->object,8);
  FIX::DataDictionary::addField(&this->object,9);
  FIX::DataDictionary::addField(&this->object,0x23);
  FIX::DataDictionary::addField(&this->object,10);
  FIX::DataDictionary::addField(&this->object,0x28);
  FIX::DataDictionary::addField(&this->object,0x211);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"D",&local_31);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->field_0xd0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"D",&local_31);
  FIX::DataDictionary::addMsgField(&this->object,&local_30,0x28);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"D",&local_31);
  FIX::DataDictionary::addMsgField(&this->object,&local_30,0x211);
  std::__cxx11::string::~string((string *)&local_30);
  FIX::DataDictionary::addFieldType(&this->object,0x28,Char);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1",&local_31);
  FIX::DataDictionary::addFieldValue(&this->object,0x28,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  FIX::DataDictionary::addFieldType(&this->object,0x211,MultipleValueString);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1",&local_31);
  FIX::DataDictionary::addFieldValue(&this->object,0x211,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"2",&local_31);
  FIX::DataDictionary::addFieldValue(&this->object,0x211,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"3",&local_31);
  FIX::DataDictionary::addFieldValue(&this->object,0x211,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

checkValueFixture()
  {
    object.setVersion( BeginString_FIX40 );
    object.addField( FIELD::BeginString );
    object.addField( FIELD::BodyLength );
    object.addField( FIELD::MsgType );
    object.addField( FIELD::CheckSum );
    object.addField( FIELD::OrdType );
    object.addField( FIELD::OrderRestrictions );
    object.addMsgType( MsgType_NewOrderSingle );
    object.addMsgField( MsgType_NewOrderSingle, FIELD::OrdType );
    object.addMsgField( MsgType_NewOrderSingle, FIELD::OrderRestrictions );
    object.addFieldType( FIELD::OrdType, TYPE::Char );
    object.addFieldValue( FIELD::OrdType, "1" );
    object.addFieldType( FIELD::OrderRestrictions, TYPE::MultipleValueString );
    object.addFieldValue( FIELD::OrderRestrictions, "1" );
    object.addFieldValue( FIELD::OrderRestrictions, "2" );
    object.addFieldValue( FIELD::OrderRestrictions, "3" );
  }